

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::~MatcherBase
          (MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *this)

{
  MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *this_local;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_029ba5b8;
  Destroy(this);
  MatcherDescriberInterface::~MatcherDescriberInterface(&this->super_MatcherDescriberInterface);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }